

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::GenerateGlobalStateFunctionDeclarations
          (FileGenerator *this,Printer *printer)

{
  size_type sVar1;
  pointer pcVar2;
  string local_58;
  string local_38;
  
  FileLevelNamespace(&local_38,*(string **)this->file_);
  sVar1 = (this->options_).dllexport_decl._M_string_length;
  if (sVar1 == 0) {
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"");
  }
  else {
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    pcVar2 = (this->options_).dllexport_decl._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>((string *)&local_58,pcVar2,pcVar2 + sVar1);
    std::__cxx11::string::append((char *)&local_58);
  }
  io::Printer::Print(printer,
                     "\nnamespace $file_namespace$ {\n// Internal implementation detail -- do not call these.\nstruct $dllexport_decl$TableStruct {\n  static const ::google::protobuf::internal::ParseTableField entries[];\n  static const ::google::protobuf::internal::AuxillaryParseTableField aux[];\n  static const ::google::protobuf::internal::ParseTable schema[];\n  static const ::google::protobuf::uint32 offsets[];\n  static void InitDefaultsImpl();\n  static void Shutdown();\n};\nvoid $dllexport_decl$AddDescriptors();\nvoid $dllexport_decl$InitDefaults();\n}  // namespace $file_namespace$\n"
                     ,"file_namespace",&local_38,"dllexport_decl",&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void FileGenerator::GenerateGlobalStateFunctionDeclarations(
    io::Printer* printer) {
  // Forward-declare the AddDescriptors, AssignDescriptors, and ShutdownFile
  // functions, so that we can declare them to be friends of each class.
  printer->Print(
      "\n"
      "namespace $file_namespace$ {\n"
      "// Internal implementation detail -- do not call these.\n"
      "struct $dllexport_decl$TableStruct {\n"
      "  static const ::google::protobuf::internal::ParseTableField entries[];\n"
      "  static const ::google::protobuf::internal::AuxillaryParseTableField aux[];\n"
      "  static const ::google::protobuf::internal::ParseTable schema[];\n"
      "  static const ::google::protobuf::uint32 offsets[];\n"
      // The following function(s) need to be able to access private members of
      // the messages defined in the file. So we make them static members.
      // This is the internal implementation of InitDefaults. It should only
      // be called by InitDefaults which makes sure it will be called only once.
      "  static void InitDefaultsImpl();\n"
      "  static void Shutdown();\n"
      "};\n"
      "void $dllexport_decl$AddDescriptors();\n"
      "void $dllexport_decl$InitDefaults();\n"
      "}  // namespace $file_namespace$\n",
      "file_namespace", FileLevelNamespace(file_->name()), "dllexport_decl",
      options_.dllexport_decl.empty() ? "" : options_.dllexport_decl + " ");
}